

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O2

int Rsb_DecVerify(Rsb_Man_t *p,int nVars,word *f,word **g,int nGs,uint Truth4,word *pTemp1,
                 word *pTemp2)

{
  word *pwVar1;
  uint uVar2;
  word *pwVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  word wVar7;
  ulong uVar8;
  ulong uVar9;
  Vec_Int_t *p_00;
  uint uVar10;
  ulong uVar11;
  word *pFanins [16];
  
  bVar4 = (char)nVars - 6U & 0x1f;
  uVar8 = 0;
  uVar11 = (ulong)(uint)(1 << bVar4);
  if (1 << bVar4 < 1) {
    uVar11 = uVar8;
  }
  iVar5 = p->vFanins->nSize;
  wVar7 = Abc_Tt6Stretch((ulong)(Truth4 >> ((byte)(1 << ((byte)iVar5 & 0x1f)) & 0x1f)),iVar5);
  p_00 = p->vFanins;
  uVar2 = p_00->nSize;
  uVar10 = uVar2;
  for (; (long)uVar8 < (long)(int)uVar10; uVar8 = uVar8 + 1) {
    iVar5 = Vec_IntEntry(p_00,(int)uVar8);
    if (nGs <= iVar5) {
      __assert_fail("Num < nGs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/rsb/rsbDec6.c"
                    ,0x23f,
                    "int Rsb_DecVerify(Rsb_Man_t *, int, word *, word **, int, unsigned int, word *, word *)"
                   );
    }
    pFanins[uVar8] = g[iVar5];
    p_00 = p->vFanins;
    uVar10 = p_00->nSize;
  }
  if (nVars < 7) {
    uVar11 = 1;
  }
  for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    pTemp1[uVar8] = 0;
  }
  bVar4 = (byte)uVar2 & 0x1f;
  uVar10 = 1 << bVar4;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  uVar6 = 0;
  if (1 << bVar4 < 1) {
    uVar10 = 0;
    uVar6 = 0;
  }
  for (; uVar6 != uVar10; uVar6 = uVar6 + 1) {
    if (((uint)wVar7 >> (uVar6 & 0x1f) & 1) != 0) {
      for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
        pTemp2[uVar8] = 0xffffffffffffffff;
      }
      for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
        pwVar3 = pFanins[uVar8];
        if ((uVar6 >> ((uint)uVar8 & 0x1f) & 1) == 0) {
          for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
            pTemp2[uVar9] = pTemp2[uVar9] & ~pwVar3[uVar9];
          }
        }
        else {
          for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
            pTemp2[uVar9] = pTemp2[uVar9] & pwVar3[uVar9];
          }
        }
      }
      for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
        pTemp1[uVar8] = pTemp1[uVar8] | pTemp2[uVar8];
      }
    }
  }
  uVar8 = 0;
  do {
    if (uVar11 == uVar8) {
      return 1;
    }
    pwVar1 = pTemp1 + uVar8;
    pwVar3 = f + uVar8;
    uVar8 = uVar8 + 1;
  } while (*pwVar1 == *pwVar3);
  puts("Verification failed.");
  return 1;
}

Assistant:

int Rsb_DecVerify( Rsb_Man_t * p, int nVars, word * f, word ** g, int nGs, unsigned Truth4, word * pTemp1, word * pTemp2 )
{
    word * pFanins[16];
    int b, m, Num, nSuppSize;
    int nWords = Abc_TtWordNum(nVars);
    Truth4 >>= (1 << Vec_IntSize(p->vFanins));
    Truth4 = (unsigned)Abc_Tt6Stretch( (word)Truth4, Vec_IntSize(p->vFanins) );
//Kit_DsdPrintFromTruth( (unsigned *)&Truth4, Vec_IntSize(p->vFanins) );
//printf( "\n" );
//    nSuppSize = Rsb_Word6SupportSize( Truth4 );
//    assert( nSuppSize == Vec_IntSize(p->vFanins) );
    nSuppSize = Vec_IntSize(p->vFanins);
    // collect the fanins
    Vec_IntForEachEntry( p->vFanins, Num, b )
    {
        assert( Num < nGs );
        pFanins[b] = g[Num];
    }
    // create the or of ands
    Abc_TtClear( pTemp1, nWords );
    for ( m = 0; m < (1<<nSuppSize); m++ )
    {
        if ( ((Truth4 >> m) & 1) == 0 )
            continue;
        Abc_TtFill( pTemp2, nWords );
        for ( b = 0; b < nSuppSize; b++ )
            if ( (m >> b) & 1 )
                Abc_TtAnd( pTemp2, pTemp2, pFanins[b], nWords, 0 );
            else
                Abc_TtSharp( pTemp2, pTemp2, pFanins[b], nWords );
        Abc_TtOr( pTemp1, pTemp1, pTemp2, nWords );
    }
    // check the function
    if ( !Abc_TtEqual( pTemp1, f, nWords ) )
        printf( "Verification failed.\n" );
//    else
//        printf( "Verification passed.\n" );
    return 1;
}